

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O1

void __thiscall despot::LaserTag::InitialBelief(LaserTag *this)

{
  State *in_RSI;
  undefined1 in_stack_00000008 [32];
  
  InitialBelief((LaserTag *)
                &this[-1].super_BaseTag.default_action_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,in_RSI,(string)in_stack_00000008);
  return;
}

Assistant:

Belief* LaserTag::InitialBelief(const State* start, string type) const {
	//assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob, opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}